

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O0

StellaOutputProxy * __thiscall
stella::detail::StellaOutputProxy::operator<<
          (StellaOutputProxy *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *obj)

{
  ostream *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *obj_local;
  StellaOutputProxy *this_local;
  
  if (this->pOut_ != (ostream *)0x0) {
    this_00 = std::operator<<(this->pOut_,(string *)obj);
    std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
  }
  return this;
}

Assistant:

StellaOutputProxy& operator<<(const T& obj)
    {
        if (pOut_)
            (*pOut_) << obj << std::flush;
        return *this;
    }